

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O1

void anm_build_name_lists_multiple(list_t *anms)

{
  long lVar1;
  char *__s2;
  int iVar2;
  long *plVar3;
  list_node_t *plVar4;
  list_node_t *plVar5;
  long *plVar6;
  long *plVar7;
  char *pcVar8;
  anm_entry_t *tmp;
  long local_38;
  
  plVar5 = (list_node_t *)anms;
  do {
    plVar5 = plVar5->next;
    if (plVar5 == (list_node_t *)0x0) {
      return;
    }
    plVar3 = (long *)((long)plVar5->data + 0x10);
    do {
      plVar3 = (long *)*plVar3;
      if (plVar3 == (long *)0x0) break;
      pcVar8 = (char *)plVar3[2];
      plVar6 = &local_38;
      plVar4 = (list_node_t *)anms;
      do {
        plVar4 = plVar4->next;
        if (plVar4 == (list_node_t *)0x0) {
          iVar2 = 8;
          break;
        }
        plVar7 = (long *)((long)plVar4->data + 0x20);
        while (plVar7 = (long *)*plVar7, plVar7 != (long *)0x0) {
          lVar1 = plVar7[2];
          __s2 = *(char **)(lVar1 + 0x10);
          if ((__s2 == pcVar8) || (iVar2 = strcmp(pcVar8,__s2), iVar2 == 0)) {
            pcVar8 = __s2;
            if (*(long *)(lVar1 + 0x28) != 0) {
              iVar2 = 0xe;
              goto LAB_0010f345;
            }
            *plVar6 = lVar1;
            plVar6 = (long *)(lVar1 + 0x28);
          }
        }
        iVar2 = 0xb;
LAB_0010f345:
      } while (plVar7 == (long *)0x0);
    } while ((iVar2 == 8) || (iVar2 == 0xe));
  } while( true );
}

Assistant:

static void
anm_build_name_lists_multiple(
    list_t *anms)
{
    const anm_archive_t *anm, *anm2;
    const char *name;
    anm_entry_t *entry, *tmp, **nextloc;
    list_for_each(anms, anm)
        list_for_each(&anm->names, name) {
            nextloc = &tmp;
            list_for_each(anms, anm2)
                list_for_each(&anm2->entries, entry)
                    if (entry->name == name || !strcmp(name, entry->name)) {
                        name = entry->name;
                        if (entry->next_by_name)
                            goto next_name; /* we already did this name */
                        *nextloc = entry;
                        nextloc = &entry->next_by_name;
                    }
            next_name:;
        }
}